

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

bool __thiscall CLI::App::check_name(App *this,string *name_to_check)

{
  __type _Var1;
  bool bVar2;
  reference pbVar3;
  string local_210;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  undefined1 local_190 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> les;
  const_iterator __end2;
  const_iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_80;
  string local_60;
  undefined1 local_40 [8];
  string local_name;
  string *name_to_check_local;
  App *this_local;
  
  local_name.field_2._8_8_ = name_to_check;
  ::std::__cxx11::string::string((string *)local_40,(string *)&this->name_);
  if ((this->ignore_underscore_ & 1U) != 0) {
    ::std::__cxx11::string::string((string *)&local_80,(string *)&this->name_);
    detail::remove_underscore(&local_60,&local_80);
    ::std::__cxx11::string::operator=((string *)local_40,(string *)&local_60);
    ::std::__cxx11::string::~string((string *)&local_60);
    ::std::__cxx11::string::~string((string *)&local_80);
    ::std::__cxx11::string::string((string *)&local_d0,(string *)name_to_check);
    detail::remove_underscore(&local_b0,&local_d0);
    ::std::__cxx11::string::operator=((string *)name_to_check,(string *)&local_b0);
    ::std::__cxx11::string::~string((string *)&local_b0);
    ::std::__cxx11::string::~string((string *)&local_d0);
  }
  if ((this->ignore_case_ & 1U) != 0) {
    ::std::__cxx11::string::string((string *)&local_110,(string *)&this->name_);
    detail::to_lower(&local_f0,&local_110);
    ::std::__cxx11::string::operator=((string *)local_40,(string *)&local_f0);
    ::std::__cxx11::string::~string((string *)&local_f0);
    ::std::__cxx11::string::~string((string *)&local_110);
    ::std::__cxx11::string::string((string *)&local_150,(string *)name_to_check);
    detail::to_lower(&local_130,&local_150);
    ::std::__cxx11::string::operator=((string *)name_to_check,(string *)&local_130);
    ::std::__cxx11::string::~string((string *)&local_130);
    ::std::__cxx11::string::~string((string *)&local_150);
  }
  _Var1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_40,name_to_check);
  if (_Var1) {
    this_local._7_1_ = 1;
  }
  else {
    __end2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin(&this->aliases_);
    les.field_2._8_8_ =
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end(&this->aliases_);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)((long)&les.field_2 + 8)), bVar2) {
      pbVar3 = __gnu_cxx::
               __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&__end2);
      ::std::__cxx11::string::string((string *)local_190,(string *)pbVar3);
      if ((this->ignore_underscore_ & 1U) != 0) {
        ::std::__cxx11::string::string((string *)&local_1d0,(string *)local_190);
        detail::remove_underscore(&local_1b0,&local_1d0);
        ::std::__cxx11::string::operator=((string *)local_190,(string *)&local_1b0);
        ::std::__cxx11::string::~string((string *)&local_1b0);
        ::std::__cxx11::string::~string((string *)&local_1d0);
      }
      if ((this->ignore_case_ & 1U) != 0) {
        ::std::__cxx11::string::string((string *)&local_210,(string *)local_190);
        detail::to_lower(&local_1f0,&local_210);
        ::std::__cxx11::string::operator=((string *)local_190,(string *)&local_1f0);
        ::std::__cxx11::string::~string((string *)&local_1f0);
        ::std::__cxx11::string::~string((string *)&local_210);
      }
      _Var1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_190,name_to_check);
      if (_Var1) {
        this_local._7_1_ = 1;
      }
      ::std::__cxx11::string::~string((string *)local_190);
      if (_Var1) goto LAB_0013cd5d;
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end2);
    }
    this_local._7_1_ = 0;
  }
LAB_0013cd5d:
  ::std::__cxx11::string::~string((string *)local_40);
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool check_name(std::string name_to_check) const {
        std::string local_name = name_;
        if(ignore_underscore_) {
            local_name = detail::remove_underscore(name_);
            name_to_check = detail::remove_underscore(name_to_check);
        }
        if(ignore_case_) {
            local_name = detail::to_lower(name_);
            name_to_check = detail::to_lower(name_to_check);
        }

        if(local_name == name_to_check) {
            return true;
        }
        for(auto les : aliases_) {
            if(ignore_underscore_) {
                les = detail::remove_underscore(les);
            }
            if(ignore_case_) {
                les = detail::to_lower(les);
            }
            if(les == name_to_check) {
                return true;
            }
        }
        return false;
    }